

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O1

void Wavegeneral_v(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  double dVar16;
  
  if (fsize <= n) {
    uVar6 = n >> 1;
    if (isign < 0) {
      if (0 < n) {
        iVar3 = uVar6 - fsize / 2;
        iVar12 = *(int *)(a + 8);
        plVar1 = *(long **)(a + 0x48);
        lVar11 = (long)JJ * 4 + *(long *)(a + 0x10);
        uVar10 = 0;
        do {
          iVar3 = iVar3 + 1;
          Wavegeneral_v::b[uVar10] = 0.0;
          Wavegeneral_v::b[uVar10 + 1] = 0.0;
          if (1 < fsize) {
            fVar15 = Wavegeneral_v::b[uVar10];
            fVar13 = Wavegeneral_v::b[uVar10 | 1];
            lVar7 = (ulong)(uint)fsize + 2;
            iVar9 = iVar3;
            do {
              iVar5 = (int)((long)((ulong)(uint)((int)((long)iVar9 % (long)iVar12) >> 0x1f) << 0x20
                                  | (long)iVar9 % (long)iVar12 & 0xffffffffU) % (long)(int)uVar6);
              dVar14 = (double)*(float *)(lVar11 + *plVar1 * (long)iVar5);
              dVar16 = (double)*(float *)(lVar11 + (long)(int)(iVar5 + uVar6) * *plVar1);
              fVar15 = (float)((double)fVar15 + P[lVar7 + -4] * dVar14 + Q[lVar7 + -4] * dVar16);
              fVar13 = (float)((double)fVar13 + dVar14 * P[lVar7 + -3] + dVar16 * Q[lVar7 + -3]);
              lVar7 = lVar7 + -2;
              iVar9 = iVar9 + 1;
            } while (3 < lVar7);
            Wavegeneral_v::b[uVar10] = fVar15;
            Wavegeneral_v::b[uVar10 | 1] = fVar13;
          }
          uVar10 = uVar10 + 2;
        } while (uVar10 < (uint)n);
      }
    }
    else if (0 < n) {
      plVar1 = *(long **)(a + 0x48);
      lVar11 = *(long *)(a + 0x10);
      uVar10 = 0;
      iVar12 = 0;
      do {
        lVar7 = uVar10 + uVar6;
        Wavegeneral_v::b[uVar10] = 0.0;
        Wavegeneral_v::b[lVar7] = 0.0;
        if (0 < fsize) {
          lVar2 = *plVar1;
          uVar8 = 0;
          do {
            dVar14 = (double)*(float *)((long)JJ * 4 + lVar11 +
                                       ((ulong)(uint)((int)uVar8 + iVar12) % (ulong)(uint)n) * lVar2
                                       );
            Wavegeneral_v::b[uVar10] = (float)(P[uVar8] * dVar14 + (double)Wavegeneral_v::b[uVar10])
            ;
            Wavegeneral_v::b[lVar7] = (float)(dVar14 * Q[uVar8] + (double)Wavegeneral_v::b[lVar7]);
            uVar8 = uVar8 + 1;
          } while ((uint)fsize != uVar8);
        }
        iVar12 = iVar12 + 2;
        uVar10 = uVar10 + 1;
      } while (uVar10 != (n - 1U >> 1) + 1);
    }
    if (0 < n) {
      lVar11 = **(long **)(a + 0x48);
      puVar4 = (undefined4 *)((long)JJ * 4 + *(long *)(a + 0x10));
      lVar7 = 0;
      do {
        *puVar4 = *(undefined4 *)((long)Wavegeneral_v::b + lVar7);
        lVar7 = lVar7 + 4;
        puVar4 = (undefined4 *)((long)puVar4 + lVar11);
      } while ((ulong)(uint)n << 2 != lVar7);
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_v(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0, j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f;
      b[i+nh]=0.0f;
			
      for(int k = 0; k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>( (j+k)%n, JJ);
        b[i+nh] += Q[k] * a.at<float>( (j+k)%n, JJ);
      }
    }
  } 
  else 
  {
    for (int i = 0,r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
        b[i+1] += P[k+1] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k+1] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
      }
    }
  }
  for(int i = 0; i < n; ++i)
    a.at<float>(i, JJ) = b[i];
}